

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::ProducedDirectoryNodeTask::inputsAvailable
          (ProducedDirectoryNodeTask *this,TaskInterface ti)

{
  BuildSystemImpl *pBVar1;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  BuildValue local_80;
  
  if (this->returnDirectorySignature == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80,
               &this->directorySignature);
  }
  else {
    if (this->isInvalid == true) {
      pBVar1 = getBuildSystem(ti);
      (*pBVar1->delegate->_vptr_BuildSystemDelegate[6])();
      local_80.kind = FailedInput;
      local_80._4_8_ = 0;
      local_80._12_8_ = 0;
      local_80.valueData._4_8_ = 0;
      local_80.valueData._12_8_ = 0;
      local_80.valueData._20_8_ = 0;
      local_80.valueData._28_8_ = 0;
      local_80.valueData._36_8_ = 0;
      local_80.valueData._44_8_ = 0;
      local_80.valueData._52_8_ = 0;
      local_80.valueData._60_8_ = 0;
      local_80.valueData._68_8_ = 0;
      local_80.valueData._76_4_ = 0;
      local_80.stringValues.contents._0_4_ = 0;
      local_80.stringValues.contents._4_4_ = 0;
      local_80.stringValues.size = 0;
      llbuild::buildsystem::BuildValue::toData((ValueType *)&local_98,&local_80);
      llbuild::core::TaskInterface::complete
                ((TaskInterface *)&stack0xffffffffffffff58,(ValueType *)&local_98,false);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
      llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
      return;
    }
    if ((this->nodeResult).kind == Invalid) {
      __assert_fail("!nodeResult.isInvalid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x37f,
                    "virtual void (anonymous namespace)::ProducedDirectoryNodeTask::inputsAvailable(TaskInterface)"
                   );
    }
    llbuild::buildsystem::BuildValue::toData((ValueType *)&local_80,&this->nodeResult);
  }
  llbuild::core::TaskInterface::complete
            ((TaskInterface *)&stack0xffffffffffffff58,(ValueType *)&local_80,false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_80);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (returnDirectorySignature) {
      ti.complete(ValueType(directorySignature));
      return;
    } else {
      if (isInvalid) {
        getBuildSystem(ti).getDelegate().hadCommandFailure();
        ti.complete(BuildValue::makeFailedInput().toData());
        return;
      }
      assert(!nodeResult.isInvalid());
      
      // Complete the task immediately.
      ti.complete(nodeResult.toData());
    }
  }